

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O1

int __thiscall QuadraticFunctor::operator()(QuadraticFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  lVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (((0 < lVar5) && (lVar5 != 1)) && (2 < lVar5)) {
    lVar5 = (this->measuredValues).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    if (((0 < lVar5) &&
        (lVar9 = (this->measuredValues).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
        0 < lVar9)) && (lVar9 != 1)) {
      pdVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar1 = *pdVar6;
      dVar2 = pdVar6[1];
      dVar3 = pdVar6[2];
      pdVar6 = (this->measuredValues).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      pdVar7 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar9 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows;
      lVar8 = 0;
      if (0 < lVar9) {
        lVar8 = lVar9;
      }
      lVar9 = 1;
      do {
        if (lVar9 - lVar8 == 1) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar4 = pdVar6[lVar9 + -1];
        pdVar7[lVar9 + -1] =
             pdVar6[lVar5 + lVar9 + -1] - (dVar1 * dVar4 * dVar4 + dVar2 * dVar4 + dVar3);
        bVar10 = lVar9 != lVar5;
        lVar9 = lVar9 + 1;
      } while (bVar10);
    }
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                 );
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
    {
        // 'x' has dimensions n x 1
        // It contains the current estimates for the parameters.

        // 'fvec' has dimensions m x 1
        // It will contain the error for each data point.

        double aParam = x(0);
        double bParam = x(1);
        double cParam = x(2);

        for (int i = 0; i < values(); i++)
        {
            double xValue = measuredValues(i, 0);
            double yValue = measuredValues(i, 1);

            fvec(i) = yValue - (aParam * xValue * xValue + bParam * xValue + cParam);
        }
    }